

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  long in_RSI;
  int in_EDI;
  int n;
  int amount;
  int i;
  string *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  string local_118 [36];
  int local_f4;
  int local_f0;
  allocator local_e9;
  string local_e8 [24];
  string *in_stack_ffffffffffffff30;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  int local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    if (local_8 <= local_14) {
      bVar2 = Settings::bundleLibs();
      if ((!bVar2) && (iVar3 = Settings::fileToFixAmount(), iVar3 < 1)) {
        showHelp();
        exit(0);
      }
      std::operator<<((ostream *)&std::cout,"* Collecting dependencies");
      fflush(_stdout);
      local_f0 = Settings::fileToFixAmount();
      for (local_f4 = 0; local_f4 < local_f0; local_f4 = local_f4 + 1) {
        Settings::fileToFix_abi_cxx11_((int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
        collectDependencies(in_stack_ffffffffffffff30);
        std::__cxx11::string::~string(local_118);
      }
      collectSubDependencies();
      doneWithDeps_go();
      return 0;
    }
    iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-x");
    if ((iVar3 == 0) ||
       (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--fix-file"), iVar3 == 0)) {
      local_14 = local_14 + 1;
      pcVar1 = *(char **)(local_10 + (long)local_14 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar1,&local_39);
      Settings::addFileToFix((string *)0x13e04f);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else {
      iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-b");
      if ((iVar3 == 0) ||
         (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--bundle-deps"), iVar3 == 0)) {
        Settings::bundleLibs(true);
      }
      else {
        iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-p");
        if ((iVar3 == 0) ||
           (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--install-path"), iVar3 == 0))
        {
          local_14 = local_14 + 1;
          pcVar1 = *(char **)(local_10 + (long)local_14 * 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_70,pcVar1,&local_71);
          Settings::inside_lib_path((string *)0x13e1c1);
          std::__cxx11::string::~string(local_70);
          std::allocator<char>::~allocator((allocator<char> *)&local_71);
        }
        else {
          iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-i");
          if ((iVar3 == 0) ||
             (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--ignore"), iVar3 == 0)) {
            local_14 = local_14 + 1;
            pcVar1 = *(char **)(local_10 + (long)local_14 * 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_98,pcVar1,&local_99);
            Settings::ignore_prefix(in_stack_fffffffffffffe90);
            std::__cxx11::string::~string(local_98);
            std::allocator<char>::~allocator((allocator<char> *)&local_99);
          }
          else {
            iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-d");
            if ((iVar3 == 0) ||
               (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--dest-dir"), iVar3 == 0))
            {
              local_14 = local_14 + 1;
              pcVar1 = *(char **)(local_10 + (long)local_14 * 8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
              Settings::destFolder((string *)0x13e3f3);
              std::__cxx11::string::~string(local_c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_c1);
            }
            else {
              iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-of");
              if ((iVar3 == 0) ||
                 (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--overwrite-files"),
                 iVar3 == 0)) {
                Settings::canOverwriteFiles(true);
              }
              else {
                iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-od");
                if ((iVar3 == 0) ||
                   (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--overwrite-dir"),
                   iVar3 == 0)) {
                  Settings::canOverwriteDir(true);
                  Settings::canCreateDir(true);
                }
                else {
                  iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-cd");
                  if ((iVar3 == 0) ||
                     (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--create-dir"),
                     iVar3 == 0)) {
                    Settings::canCreateDir(true);
                  }
                  else {
                    iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-ns");
                    if ((iVar3 == 0) ||
                       (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--no-codesign"),
                       iVar3 == 0)) {
                      Settings::canCodesign(false);
                    }
                    else {
                      iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-h");
                      if ((iVar3 == 0) ||
                         (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--help"),
                         iVar3 == 0)) {
                        showHelp();
                        exit(0);
                      }
                      iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"-s");
                      if ((iVar3 == 0) ||
                         (iVar3 = strcmp(*(char **)(local_10 + (long)local_14 * 8),"--search-path"),
                         iVar3 == 0)) {
                        local_14 = local_14 + 1;
                        in_stack_fffffffffffffe98 = *(char **)(local_10 + (long)local_14 * 8);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_e8,in_stack_fffffffffffffe98,&local_e9);
                        Settings::addSearchPath((string *)0x13e6df);
                        std::__cxx11::string::~string(local_e8);
                        std::allocator<char>::~allocator((allocator<char> *)&local_e9);
                      }
                      else if (0 < local_14) {
                        poVar4 = std::operator<<((ostream *)&std::cerr,"Unknown flag ");
                        poVar4 = std::operator<<(poVar4,*(char **)(local_10 + (long)local_14 * 8));
                        poVar4 = (ostream *)
                                 std::ostream::operator<<
                                           (poVar4,std::endl<char,std::char_traits<char>>);
                        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                        showHelp();
                        exit(1);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int main (int argc, char * const argv[])
{
    
    // parse arguments    
    for(int i=0; i<argc; i++)
    {
        if(strcmp(argv[i],"-x")==0 or strcmp(argv[i],"--fix-file")==0)
        {
            i++;
            Settings::addFileToFix(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-b")==0 or strcmp(argv[i],"--bundle-deps")==0)
        {
            Settings::bundleLibs(true);
            continue;    
        }
        else if(strcmp(argv[i],"-p")==0 or strcmp(argv[i],"--install-path")==0)
        {
            i++;
            Settings::inside_lib_path(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-i")==0 or strcmp(argv[i],"--ignore")==0)
        {
            i++;
            Settings::ignore_prefix(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-d")==0 or strcmp(argv[i],"--dest-dir")==0)
        {
            i++;
            Settings::destFolder(argv[i]);
            continue;
        }
        else if(strcmp(argv[i],"-of")==0 or strcmp(argv[i],"--overwrite-files")==0)
        {
            Settings::canOverwriteFiles(true);
            continue;    
        }
        else if(strcmp(argv[i],"-od")==0 or strcmp(argv[i],"--overwrite-dir")==0)
        {
            Settings::canOverwriteDir(true);
            Settings::canCreateDir(true);
            continue;    
        }
        else if(strcmp(argv[i],"-cd")==0 or strcmp(argv[i],"--create-dir")==0)
        {
            Settings::canCreateDir(true);
            continue;    
        }
        else if(strcmp(argv[i],"-ns")==0 or strcmp(argv[i],"--no-codesign")==0)
        {
            Settings::canCodesign(false);
            continue;
        }
        else if(strcmp(argv[i],"-h")==0 or strcmp(argv[i],"--help")==0)
        {
            showHelp();
            exit(0);    
        }
        if(strcmp(argv[i],"-s")==0 or strcmp(argv[i],"--search-path")==0)
        {
            i++;
            Settings::addSearchPath(argv[i]);
            continue;
        }
        else if(i>0)
        {
            // if we meet an unknown flag, abort
            // ignore first one cause it's usually the path to the executable
            std::cerr << "Unknown flag " << argv[i] << std::endl << std::endl;
            showHelp();
            exit(1);
        }
    }
    
    if(not Settings::bundleLibs() and Settings::fileToFixAmount()<1)
    {
        showHelp();
        exit(0);
    }
    
    std::cout << "* Collecting dependencies"; fflush(stdout);
    
    const int amount = Settings::fileToFixAmount();
    for(int n=0; n<amount; n++)
        collectDependencies(Settings::fileToFix(n));
    
    collectSubDependencies();
    doneWithDeps_go();
    
    return 0;
}